

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode_io.c
# Opt level: O0

int CVodeSetEtaMaxFirstStep(void *cvode_mem,realtype eta_max_fs)

{
  long in_RDI;
  double in_XMM0_Qa;
  CVodeMem cv_mem;
  int local_4;
  
  if (in_RDI == 0) {
    cvProcessError((CVodeMem)0x0,-0x15,"CVODE","CVodeSetEtaMaxFirstStep","cvode_mem = NULL illegal."
                  );
    local_4 = -0x15;
  }
  else {
    if (1.0 < in_XMM0_Qa) {
      *(double *)(in_RDI + 0x310) = in_XMM0_Qa;
    }
    else {
      *(undefined8 *)(in_RDI + 0x310) = 0x40c3880000000000;
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int CVodeSetEtaMaxFirstStep(void* cvode_mem, realtype eta_max_fs)
{
  CVodeMem cv_mem;

  if (cvode_mem == NULL) {
    cvProcessError(NULL, CV_MEM_NULL, "CVODE", "CVodeSetEtaMaxFirstStep",
                   MSGCV_NO_MEM);
    return (CV_MEM_NULL);
  }

  cv_mem = (CVodeMem) cvode_mem;

  /* set allowed value or use default */
  if (eta_max_fs <= ONE)
    cv_mem->cv_eta_max_fs = ETA_MAX_FS_DEFAULT;
  else
    cv_mem->cv_eta_max_fs = eta_max_fs;

  return(CV_SUCCESS);
}